

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::
streamDefinition(LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier> *this,
                ostringstream *str,GLenum shader)

{
  NumSys NVar1;
  _func_int *p_Var2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  
  if ((this->super_LayoutSpecifierBase).val < 0) {
    return;
  }
  bVar3 = DefOccurence::occurs
                    ((DefOccurence *)(ulong)(this->super_LayoutSpecifierBase).occurence.occurence,
                     shader);
  if (!bVar3) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&str->super_basic_ostream<char,_std::char_traits<char>_>,"layout(location = ",0x12);
  NVar1 = (this->super_LayoutSpecifierBase).numSys;
  if (NVar1 == Hex) {
    p_Var2 = (str->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3];
    *(uint *)(&(str->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 + (long)p_Var2)
         = *(uint *)(&(str->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 +
                    (long)p_Var2) & 0xffffffb5 | 8;
    pcVar6 = "0x";
    lVar5 = 2;
  }
  else {
    if (NVar1 != Oct) goto LAB_00bbb54b;
    p_Var2 = (str->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3];
    *(uint *)(&(str->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 + (long)p_Var2)
         = *(uint *)(&(str->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 +
                    (long)p_Var2) & 0xffffffb5 | 0x40;
    pcVar6 = "0";
    lVar5 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&str->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,lVar5);
LAB_00bbb54b:
  poVar4 = (ostream *)std::ostream::operator<<(str,(this->super_LayoutSpecifierBase).val);
  *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  return;
}

Assistant:

void LayoutSpecifier<LocationSpecifier>::streamDefinition(std::ostringstream& str, GLenum shader) const
{
	if (val < 0 || !occurence.occurs(shader))
	{
		return;
	}

	str << "layout(location = ";
	if (numSys == Loc::Oct)
	{
		str << std::oct << "0";
	}
	else if (numSys == Loc::Hex)
	{
		str << std::hex << "0x";
	}
	str << val << std::dec << ") ";
}